

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

bool pbrt::RemapPixelCoords(Point2i *pp,Point2i resolution,WrapMode2D wrapMode)

{
  WrapMode WVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  WrapMode2D wrapMode_local;
  
  wrapMode_local = wrapMode;
  uVar6 = resolution.super_Tuple2<pbrt::Point2,_int>.x;
  uVar7 = resolution.super_Tuple2<pbrt::Point2,_int>.y;
  if (wrapMode.wrap.values[0] != OctahedralSphere) {
    lVar8 = 0;
    do {
      bVar9 = lVar8 == 2;
      if (bVar9) {
        return bVar9;
      }
      bVar10 = lVar8 != 0;
      uVar3 = uVar7;
      if (!bVar10) {
        uVar3 = uVar6;
      }
      iVar5 = (&(pp->super_Tuple2<pbrt::Point2,_int>).x)[bVar10];
      if (iVar5 < 0 || (int)uVar3 <= iVar5) {
        WVar1 = wrapMode_local.wrap.values[lVar8];
        if (WVar1 == Repeat) {
          iVar2 = (iVar5 % (int)uVar3 >> 0x1f & uVar3) + iVar5 % (int)uVar3;
        }
        else {
          if (WVar1 != Clamp) {
            if (WVar1 == Black) {
              return bVar9;
            }
            LogFatal(Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
                     ,0x8d,"Unhandled WrapMode mode");
          }
          iVar2 = uVar3 - 1;
          if (iVar5 < (int)(uVar3 - 1)) {
            iVar2 = iVar5;
          }
          if (iVar5 < 0) {
            iVar2 = 0;
          }
        }
        (&(pp->super_Tuple2<pbrt::Point2,_int>).x)[bVar10] = iVar2;
      }
      lVar8 = lVar8 + 1;
    } while( true );
  }
  if (wrapMode.wrap.values[1] != OctahedralSphere) {
    LogFatal<char_const(&)[47]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.h"
               ,100,"Check failed: %s",
               (char (*) [47])"wrapMode.wrap[1] == WrapMode::OctahedralSphere");
  }
  uVar3 = (pp->super_Tuple2<pbrt::Point2,_int>).x;
  if ((int)uVar3 < 0) {
    uVar3 = -uVar3;
LAB_002cf923:
    (pp->super_Tuple2<pbrt::Point2,_int>).x = uVar3;
    uVar4 = ~(pp->super_Tuple2<pbrt::Point2,_int>).y + uVar7;
    (pp->super_Tuple2<pbrt::Point2,_int>).y = uVar4;
  }
  else {
    if ((int)uVar6 <= (int)uVar3) {
      uVar3 = ~uVar3 + uVar6 * 2;
      goto LAB_002cf923;
    }
    uVar4 = (pp->super_Tuple2<pbrt::Point2,_int>).y;
  }
  if ((int)uVar4 < 0) {
    iVar5 = -uVar4;
  }
  else {
    if ((int)uVar4 < (int)uVar7) goto LAB_002cf94e;
    iVar5 = ~uVar4 + uVar7 * 2;
  }
  (pp->super_Tuple2<pbrt::Point2,_int>).x = ~uVar3 + uVar6;
  (pp->super_Tuple2<pbrt::Point2,_int>).y = iVar5;
LAB_002cf94e:
  if (uVar6 == 1) {
    (pp->super_Tuple2<pbrt::Point2,_int>).x = 0;
  }
  if (uVar7 == 1) {
    (pp->super_Tuple2<pbrt::Point2,_int>).y = 0;
  }
  return true;
}

Assistant:

PBRT_CPU_GPU inline bool RemapPixelCoords(Point2i *pp, Point2i resolution,
                                          WrapMode2D wrapMode) {
    Point2i &p = *pp;

    if (wrapMode.wrap[0] == WrapMode::OctahedralSphere) {
        CHECK(wrapMode.wrap[1] == WrapMode::OctahedralSphere);
        if (p[0] < 0) {
            p[0] = -p[0];                     // mirror across u = 0
            p[1] = resolution[1] - 1 - p[1];  // mirror across v = 0.5
        } else if (p[0] >= resolution[0]) {
            p[0] = 2 * resolution[0] - 1 - p[0];  // mirror across u = 1
            p[1] = resolution[1] - 1 - p[1];      // mirror across v = 0.5
        }

        if (p[1] < 0) {
            p[0] = resolution[0] - 1 - p[0];  // mirror across u = 0.5
            p[1] = -p[1];                     // mirror across v = 0;
        } else if (p[1] >= resolution[1]) {
            p[0] = resolution[0] - 1 - p[0];      // mirror across u = 0.5
            p[1] = 2 * resolution[1] - 1 - p[1];  // mirror across v = 1
        }

        // Bleh: things don't go as expected for 1x1 images.
        if (resolution[0] == 1)
            p[0] = 0;
        if (resolution[1] == 1)
            p[1] = 0;

        return true;
    }

    for (int c = 0; c < 2; ++c) {
        if (p[c] >= 0 && p[c] < resolution[c])
            // in bounds
            continue;

        switch (wrapMode.wrap[c]) {
        case WrapMode::Repeat:
            p[c] = Mod(p[c], resolution[c]);
            break;
        case WrapMode::Clamp:
            p[c] = Clamp(p[c], 0, resolution[c] - 1);
            break;
        case WrapMode::Black:
            return false;
        default:
            LOG_FATAL("Unhandled WrapMode mode");
        }
    }
    return true;
}